

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sym_tbl.cpp
# Opt level: O0

shared_ptr<mocker::SymTbl::Scope> __thiscall mocker::SymTbl::getScope(SymTbl *this,ScopeID *ids)

{
  ulong __n;
  bool bVar1;
  reference puVar2;
  element_type *peVar3;
  size_type sVar4;
  out_of_range *this_00;
  reference pvVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::SymTbl::Scope> sVar6;
  size_t i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  ScopeID *ids_local;
  SymTbl *this_local;
  shared_ptr<mocker::SymTbl::Scope> *res;
  
  std::shared_ptr<mocker::SymTbl::Scope>::shared_ptr
            (&this->root,(shared_ptr<mocker::SymTbl::Scope> *)ids);
  __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_RDX);
  i = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_RDX);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&i);
    if (!bVar1) {
      sVar6.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = extraout_RDX._M_pi;
      sVar6.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<mocker::SymTbl::Scope>)
             sVar6.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>;
    }
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end1);
    __n = *puVar2;
    peVar3 = std::
             __shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    sVar4 = std::
            vector<std::shared_ptr<mocker::SymTbl::Scope>,_std::allocator<std::shared_ptr<mocker::SymTbl::Scope>_>_>
            ::size(&peVar3->subscopes);
    if (sVar4 <= __n) break;
    peVar3 = std::
             __shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    pvVar5 = std::
             vector<std::shared_ptr<mocker::SymTbl::Scope>,_std::allocator<std::shared_ptr<mocker::SymTbl::Scope>_>_>
             ::operator[](&peVar3->subscopes,__n);
    std::shared_ptr<mocker::SymTbl::Scope>::operator=(&this->root,pvVar5);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1);
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Scope required does not exist");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

std::shared_ptr<SymTbl::Scope> SymTbl::getScope(const ScopeID &ids) const {
  auto res = root;
  for (const std::size_t i : ids.ids) {
    if (i >= res->subscopes.size())
      throw std::out_of_range("Scope required does not exist");
    res = res->subscopes[i];
  }
  return res;
}